

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_hashtable.cpp
# Opt level: O1

void __thiscall duckdb::JoinHashTable::ProbeSpill::Finalize(ProbeSpill *this)

{
  pointer puVar1;
  _Head_base<0UL,_duckdb::PartitionedColumnData_*,_false> _Var2;
  unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>_>
  *puVar3;
  unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>_>
  *puVar4;
  reference this_00;
  pointer pPVar5;
  reference this_01;
  type state;
  type other;
  pointer *__ptr;
  size_type __n;
  pointer puVar6;
  unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>,_true>
  *local_partition;
  pointer puVar7;
  unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>_>
  *this_02;
  
  if ((this->local_partition_append_states).
      super_vector<duckdb::unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->local_partition_append_states).
      super_vector<duckdb::unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      this_00 = vector<duckdb::unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>,_true>,_true>
                ::operator[](&this->local_partitions,__n);
      pPVar5 = unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>,_true>
               ::operator->(this_00);
      this_01 = vector<duckdb::unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>,_true>
                ::operator[](&this->local_partition_append_states,__n);
      state = unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>
              ::operator*(this_01);
      PartitionedColumnData::FlushAppendState(pPVar5,state);
      __n = __n + 1;
    } while (__n < (ulong)((long)(this->local_partition_append_states).
                                 super_vector<duckdb::unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->local_partition_append_states).
                                 super_vector<duckdb::unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  puVar7 = (this->local_partitions).
           super_vector<duckdb::unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->local_partitions).
           super_vector<duckdb::unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar7 != puVar1) {
    do {
      pPVar5 = unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>,_true>
               ::operator->(&this->global_partitions);
      other = unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>,_true>
              ::operator*(puVar7);
      PartitionedColumnData::Combine(pPVar5,other);
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar1);
  }
  puVar7 = (this->local_partitions).
           super_vector<duckdb::unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->local_partitions).
           super_vector<duckdb::unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar6 = puVar7;
  if (puVar1 != puVar7) {
    do {
      _Var2._M_head_impl =
           (puVar6->
           super_unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>_>
           )._M_t.
           super___uniq_ptr_impl<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::PartitionedColumnData_*,_std::default_delete<duckdb::PartitionedColumnData>_>
           .super__Head_base<0UL,_duckdb::PartitionedColumnData_*,_false>._M_head_impl;
      if (_Var2._M_head_impl != (PartitionedColumnData *)0x0) {
        (**(code **)((long)(_Var2._M_head_impl)->_vptr_PartitionedColumnData + 8))();
      }
      (puVar6->
      super_unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>_>
      )._M_t.
      super___uniq_ptr_impl<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::PartitionedColumnData_*,_std::default_delete<duckdb::PartitionedColumnData>_>
      .super__Head_base<0UL,_duckdb::PartitionedColumnData_*,_false>._M_head_impl =
           (PartitionedColumnData *)0x0;
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar1);
    (this->local_partitions).
    super_vector<duckdb::unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionedColumnData,_std::default_delete<duckdb::PartitionedColumnData>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar7;
  }
  puVar3 = &((this->local_partition_append_states).
             super_vector<duckdb::unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
            super_unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>_>
  ;
  puVar4 = &((this->local_partition_append_states).
             super_vector<duckdb::unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super_unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>_>
  ;
  this_02 = puVar3;
  if (puVar4 != puVar3) {
    do {
      ::std::
      unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>_>
      ::~unique_ptr(this_02);
      this_02 = this_02 + 1;
    } while (this_02 != puVar4);
    (this->local_partition_append_states).
    super_vector<duckdb::unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)puVar3;
  }
  return;
}

Assistant:

void ProbeSpill::Finalize() {
	D_ASSERT(local_partitions.size() == local_partition_append_states.size());
	for (idx_t i = 0; i < local_partition_append_states.size(); i++) {
		local_partitions[i]->FlushAppendState(*local_partition_append_states[i]);
	}
	for (auto &local_partition : local_partitions) {
		global_partitions->Combine(*local_partition);
	}
	local_partitions.clear();
	local_partition_append_states.clear();
}